

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationWeights::allocWeightsInMinLengthRanges
          (CollationWeights *this,int32_t n,int32_t minLength)

{
  int32_t iVar1;
  uint32_t uVar2;
  bool bVar3;
  int local_40;
  int local_3c;
  int32_t count1;
  int32_t count2;
  int32_t i;
  uint32_t end;
  uint32_t start;
  int32_t nextCountBytes;
  int32_t minLengthRangeCount;
  int32_t count;
  int32_t minLength_local;
  int32_t n_local;
  CollationWeights *this_local;
  
  nextCountBytes = 0;
  start = 0;
  while( true ) {
    bVar3 = false;
    if ((int)start < this->rangeCount) {
      bVar3 = this->ranges[(int)start].length == minLength;
    }
    if (!bVar3) break;
    nextCountBytes = this->ranges[(int)start].count + nextCountBytes;
    start = start + 1;
  }
  iVar1 = countBytes(this,minLength + 1);
  if (nextCountBytes * iVar1 < n) {
    this_local._7_1_ = '\0';
  }
  else {
    i = this->ranges[0].start;
    count2 = this->ranges[0].end;
    for (count1 = 1; count1 < (int)start; count1 = count1 + 1) {
      if (this->ranges[count1].start < (uint)i) {
        i = this->ranges[count1].start;
      }
      if ((uint)count2 < this->ranges[count1].end) {
        count2 = this->ranges[count1].end;
      }
    }
    local_3c = (n - nextCountBytes) / (iVar1 + -1);
    local_40 = nextCountBytes - local_3c;
    if ((local_3c == 0) || (local_40 + local_3c * iVar1 < n)) {
      local_3c = local_3c + 1;
      local_40 = local_40 + -1;
    }
    this->ranges[0].start = i;
    if (local_40 == 0) {
      this->ranges[0].end = count2;
      this->ranges[0].count = nextCountBytes;
      lengthenRange(this,this->ranges);
      this->rangeCount = 1;
    }
    else {
      uVar2 = incWeightByOffset(this,i,minLength,local_40 + -1);
      this->ranges[0].end = uVar2;
      this->ranges[0].count = local_40;
      uVar2 = incWeight(this,this->ranges[0].end,minLength);
      this->ranges[1].start = uVar2;
      this->ranges[1].end = count2;
      this->ranges[1].length = minLength;
      this->ranges[1].count = local_3c;
      lengthenRange(this,this->ranges + 1);
      this->rangeCount = 2;
    }
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationWeights::allocWeightsInMinLengthRanges(int32_t n, int32_t minLength) {
    // See if the minLength ranges have enough weights
    // when we split one and lengthen the following ones.
    int32_t count = 0;
    int32_t minLengthRangeCount;
    for(minLengthRangeCount = 0;
            minLengthRangeCount < rangeCount &&
                ranges[minLengthRangeCount].length == minLength;
            ++minLengthRangeCount) {
        count += ranges[minLengthRangeCount].count;
    }

    int32_t nextCountBytes = countBytes(minLength + 1);
    if(n > count * nextCountBytes) { return FALSE; }

    // Use the minLength ranges. Merge them, and then split again as necessary.
    uint32_t start = ranges[0].start;
    uint32_t end = ranges[0].end;
    for(int32_t i = 1; i < minLengthRangeCount; ++i) {
        if(ranges[i].start < start) { start = ranges[i].start; }
        if(ranges[i].end > end) { end = ranges[i].end; }
    }

    // Calculate how to split the range between minLength (count1) and minLength+1 (count2).
    // Goal:
    //   count1 + count2 * nextCountBytes = n
    //   count1 + count2 = count
    // These turn into
    //   (count - count2) + count2 * nextCountBytes = n
    // and then into the following count1 & count2 computations.
    int32_t count2 = (n - count) / (nextCountBytes - 1);  // number of weights to be lengthened
    int32_t count1 = count - count2;  // number of minLength weights
    if(count2 == 0 || (count1 + count2 * nextCountBytes) < n) {
        // round up
        ++count2;
        --count1;
        U_ASSERT((count1 + count2 * nextCountBytes) >= n);
    }

    ranges[0].start = start;

    if(count1 == 0) {
        // Make one long range.
        ranges[0].end = end;
        ranges[0].count = count;
        lengthenRange(ranges[0]);
        rangeCount = 1;
    } else {
        // Split the range, lengthen the second part.
#ifdef UCOL_DEBUG
        printf("split the range number %ld (out of %ld minLength ranges) by %ld:%ld\n",
               splitRange, rangeCount, count1, count2);
#endif

        // Next start = start + count1. First end = 1 before that.
        ranges[0].end = incWeightByOffset(start, minLength, count1 - 1);
        ranges[0].count = count1;

        ranges[1].start = incWeight(ranges[0].end, minLength);
        ranges[1].end = end;
        ranges[1].length = minLength;  // +1 when lengthened
        ranges[1].count = count2;  // *countBytes when lengthened
        lengthenRange(ranges[1]);
        rangeCount = 2;
    }
    return TRUE;
}